

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaANCF_3813.cpp
# Opt level: O2

void __thiscall chrono::fea::ChElementHexaANCF_3813::SetupInitial(ChElementHexaANCF_3813 *this)

{
  ChSystem *in_RSI;
  
  SetupInitial((ChElementHexaANCF_3813 *)&this[-1].field_0x4a78,in_RSI);
  return;
}

Assistant:

void ChElementHexaANCF_3813::SetupInitial(ChSystem* system) {
    // Compute gravitational forces
    ComputeGravityForceScale();
    // Compute mass matrix
    ComputeMassMatrix();
    // initial EAS parameters
    m_stock_jac_EAS.setZero();
    // Compute stiffness matrix
    // (this is not constant in ANCF and will be called automatically many times by ComputeKRMmatricesGlobal()
    // when the solver will run, yet maybe nice to privide an initial nonzero value)
    ComputeStiffnessMatrix();
}